

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetCompilePDBName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  string *psVar3;
  NameComponents *pNVar4;
  long *plVar5;
  size_type *psVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string configProp;
  string configUpper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  pointer local_78;
  undefined8 local_70;
  string local_68;
  string local_48;
  
  cmsys::SystemTools::UpperCase(&local_48,config);
  local_98._M_dataplus._M_p = &DAT_00000011;
  local_98._M_string_length = 0x97e253;
  local_98.field_2._M_allocated_capacity = 0;
  local_98.field_2._8_8_ = local_48._M_string_length;
  local_78 = local_48._M_dataplus._M_p;
  local_70 = 0;
  views._M_len = 2;
  views._M_array = (iterator)&local_98;
  cmCatViews(&local_68,views);
  psVar3 = (string *)GetProperty(this,&local_68);
  if ((psVar3 == (string *)0x0) || (psVar3->_M_string_length == 0)) {
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"COMPILE_PDB_NAME","");
    psVar3 = (string *)GetProperty(this,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((psVar3 == (string *)0x0) || (psVar3->_M_string_length == 0)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_0060236f;
    }
    pNVar4 = GetFullNameInternalComponents(this,config,RuntimeBinaryArtifact);
    if (psVar3 == (string *)0x0) {
      psVar3 = &cmValue::Empty_abi_cxx11_;
    }
    std::operator+(&local_98,&pNVar4->prefix,psVar3);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar1) goto LAB_0060236f;
  }
  else {
    pNVar4 = GetFullNameInternalComponents(this,config,RuntimeBinaryArtifact);
    if (psVar3 == (string *)0x0) {
      psVar3 = &cmValue::Empty_abi_cxx11_;
    }
    std::operator+(&local_98,&pNVar4->prefix,psVar3);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0060236f;
  }
  operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
LAB_0060236f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCompilePDBName(
  const std::string& config) const
{
  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(config);
  std::string configProp = cmStrCat("COMPILE_PDB_NAME_", configUpper);
  cmValue config_name = this->GetProperty(configProp);
  if (cmNonempty(config_name)) {
    NameComponents const& components = GetFullNameInternalComponents(
      config, cmStateEnums::RuntimeBinaryArtifact);
    return components.prefix + *config_name + ".pdb";
  }

  cmValue name = this->GetProperty("COMPILE_PDB_NAME");
  if (cmNonempty(name)) {
    NameComponents const& components = GetFullNameInternalComponents(
      config, cmStateEnums::RuntimeBinaryArtifact);
    return components.prefix + *name + ".pdb";
  }

  return "";
}